

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UILighting.cpp
# Opt level: O3

void UI::LightingMenuItems
               (shared_ptr<myvk::CommandPool> *command_pool,shared_ptr<Lighting> *lighting,
               char **open_modal)

{
  LightTypes LVar1;
  element_type *peVar2;
  element_type *v_rad;
  bool bVar3;
  ImVec2 local_28;
  
  bVar3 = ImGui::BeginMenu("Light",true);
  if (bVar3) {
    LVar1 = ((lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            m_light_type;
    bVar3 = ImGui::RadioButton("Constant Color",LVar1 == kConstantColor);
    if (bVar3) {
      ((lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_light_type =
           kConstantColor;
    }
    if (LVar1 == kConstantColor) {
      ImGui::DragFloat3("",(float *)&((lighting->
                                      super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr)->m_sun_radiance,0.1,0.0,100.0,"%.3f",0);
    }
    else {
      ImGui::PushDisabled();
      ImGui::DragFloat3("",(float *)&((lighting->
                                      super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>).
                                     _M_ptr)->m_sun_radiance,0.1,0.0,100.0,"%.3f",0);
      ImGui::PopDisabled();
    }
    ImGui::Separator();
    bVar3 = ImGui::RadioButton("Environment Map",LVar1 == kEnvironmentMap);
    if (bVar3) {
      ((lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->m_light_type =
           kEnvironmentMap;
    }
    if (LVar1 != kEnvironmentMap) {
      ImGui::PushDisabled();
    }
    local_28.x = 0.0;
    local_28.y = 0.0;
    bVar3 = ImGui::Button("Load",&local_28);
    if (bVar3) {
      *open_modal = "Load Environment Map";
    }
    if ((((((lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          m_environment_map_ptr).super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      ImGui::SameLine(0.0,-1.0);
      local_28.x = 0.0;
      local_28.y = 0.0;
      bVar3 = ImGui::Button("Unload",&local_28);
      if (bVar3) {
        myvk::Queue::WaitIdle
                  ((((command_pool->
                     super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   m_queue_ptr).super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        EnvironmentMap::Reset
                  ((((lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   m_environment_map_ptr).
                   super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      else {
        ImGui::SameLine(0.0,-1.0);
        peVar2 = (((((lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                   m_environment_map_ptr).
                   super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 m_hdr_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        ImGui::Text("(%d x %d)",
                    (ulong)((VkExtent3D *)((long)&peVar2->super_ImageBase + 0x24))->width,
                    (ulong)*(uint32_t *)((long)&peVar2->super_ImageBase + 0x28));
      }
    }
    ImGui::InputFloat("Multiplier",
                      &((((lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_environment_map_ptr).
                        super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       m_multiplier,0.0,0.0,"%.3f",0);
    v_rad = (((lighting->super___shared_ptr<Lighting,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            m_environment_map_ptr).super___shared_ptr<EnvironmentMap,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
    if (v_rad->m_multiplier <= 0.0 && v_rad->m_multiplier != 0.0) {
      v_rad->m_multiplier = 0.0;
    }
    ImGui::DragAngle("Rotation",&v_rad->m_rotation,1.0,0.0,360.0,"%.1f deg",0x10);
    if (LVar1 != kEnvironmentMap) {
      ImGui::PopDisabled();
    }
    ImGui::EndMenu();
  }
  return;
}

Assistant:

void LightingMenuItems(const std::shared_ptr<myvk::CommandPool> &command_pool,
                       const std::shared_ptr<Lighting> &lighting, const char **open_modal) {
	if (ImGui::BeginMenu("Light")) {
		auto type = lighting->m_light_type;
		bool active;

		{
			active = type == Lighting::LightTypes::kConstantColor;
			if (ImGui::RadioButton("Constant Color", active))
				lighting->m_light_type = Lighting::LightTypes::kConstantColor;

			if (!active)
				ImGui::PushDisabled();
			ImGui::DragFloat3("", &lighting->m_sun_radiance[0], 0.1f, 0.0f, kMaxConstantColor);
			if (!active)
				ImGui::PopDisabled();
		}

		ImGui::Separator();

		{
			active = type == Lighting::LightTypes::kEnvironmentMap;
			if (ImGui::RadioButton("Environment Map", active))
				lighting->m_light_type = Lighting::LightTypes::kEnvironmentMap;

			if (!active)
				ImGui::PushDisabled();
			if (ImGui::Button("Load"))
				*open_modal = kLightingLoadEnvMapModal;
			if (!lighting->GetEnvironmentMapPtr()->Empty()) {
				ImGui::SameLine();
				if (ImGui::Button("Unload")) {
					command_pool->GetQueuePtr()->WaitIdle();
					lighting->GetEnvironmentMapPtr()->Reset();
				} else {
					ImGui::SameLine();
					ImGui::Text("(%d x %d)", lighting->GetEnvironmentMapPtr()->GetImageExtent().width,
					            lighting->GetEnvironmentMapPtr()->GetImageExtent().height);
				}
			}
			ImGui::InputFloat("Multiplier", &lighting->GetEnvironmentMapPtr()->m_multiplier);
			if (lighting->GetEnvironmentMapPtr()->m_multiplier < 0.0f)
				lighting->GetEnvironmentMapPtr()->m_multiplier = 0.0f;
			ImGui::DragAngle("Rotation", &lighting->GetEnvironmentMapPtr()->m_rotation, 1, 0, 360);
			if (!active)
				ImGui::PopDisabled();
		}

		ImGui::EndMenu();
	}
}